

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

CTPNStmTop * __thiscall
CTcParser::parse_object
          (CTcParser *this,int *err,int replace,int modify,int is_class,int plus_cnt,int trans)

{
  CTcSymObj *obj_sym;
  CTPNStmTop *pCVar1;
  CTcSymMetaclass *meta_sym;
  CTcSymObj *mod_orig_sym;
  int is_class_local;
  
  is_class_local = is_class;
  obj_sym = find_or_def_obj(this,(G_tok->curtok_).text_,(G_tok->curtok_).text_len_,replace,modify,
                            &is_class_local,&mod_orig_sym,&meta_sym,&trans);
  CTcTokenizer::next(G_tok);
  pCVar1 = (CTPNStmTop *)
           parse_object_body(this,err,obj_sym,is_class_local,0,0,0,modify,mod_orig_sym,plus_cnt,
                             meta_sym,(tcprs_term_info *)0x0,trans);
  return pCVar1;
}

Assistant:

CTPNStmTop *CTcParser::parse_object(
    int *err, int replace, int modify, int is_class, int plus_cnt, int trans)
{
    /* find or define the symbol */
    CTcSymObj *mod_orig_sym;
    CTcSymMetaclass *meta_sym;
    CTcSymObj *obj_sym = find_or_def_obj(
        G_tok->getcur()->get_text(), G_tok->getcur()->get_text_len(),
        replace, modify, &is_class, &mod_orig_sym, &meta_sym, &trans);

    /* skip the object name */
    G_tok->next();

    /* parse the body */
    return parse_object_body(
        err, obj_sym, is_class, FALSE, FALSE, FALSE,
        modify, mod_orig_sym, plus_cnt, meta_sym, 0, trans);
}